

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastSet.h
# Opt level: O3

void __thiscall CFastSet<int>::GetSet(CFastSet<int> *this,CSet *set)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_40;
  
  std::set<int,std::less<int>,std::allocator<int>>::set<int*>
            ((set<int,std::less<int>,std::allocator<int>> *)&local_40,this->elements,
             this->elements + this->elementsSize);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&set->_M_t);
  if (local_40._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_40._M_impl.super__Rb_tree_header;
    (set->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color =
         local_40._M_impl.super__Rb_tree_header._M_header._M_color;
    (set->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_40._M_impl.super__Rb_tree_header._M_header._M_parent;
    (set->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         local_40._M_impl.super__Rb_tree_header._M_header._M_left;
    (set->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         local_40._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_40._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(set->_M_t)._M_impl.super__Rb_tree_header._M_header;
    (set->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
         local_40._M_impl.super__Rb_tree_header._M_node_count;
    local_40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_40._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_40._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_40._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_40);
  return;
}

Assistant:

void GetSet(CSet* set) const { *set = *this; }